

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O1

int f_seek(lua_State *L)

{
  int iVar1;
  FILE *__stream;
  long lVar2;
  lua_Number lVar3;
  double dVar4;
  
  __stream = (FILE *)tofile(L);
  iVar1 = luaL_checkoption(L,2,"cur",f_seek::modenames);
  lVar3 = luaL_optnumber(L,3,0.0);
  dVar4 = (double)(long)lVar3;
  if ((lVar3 != dVar4) || (NAN(lVar3) || NAN(dVar4))) {
    luaL_argerror(L,3,"not an integer in proper range");
  }
  iVar1 = fseek(__stream,(long)lVar3,f_seek::mode[iVar1]);
  if (iVar1 != 0) {
    iVar1 = luaL_fileresult(L,0,(char *)0x0);
    return iVar1;
  }
  lVar2 = ftell(__stream);
  lua_pushnumber(L,(double)lVar2);
  return 1;
}

Assistant:

static int f_seek (lua_State *L) {
  static const int mode[] = {SEEK_SET, SEEK_CUR, SEEK_END};
  static const char *const modenames[] = {"set", "cur", "end", NULL};
  FILE *f = tofile(L);
  int op = luaL_checkoption(L, 2, "cur", modenames);
  lua_Number p3 = luaL_optnumber(L, 3, 0);
  l_seeknum offset = (l_seeknum)p3;
  luaL_argcheck(L, (lua_Number)offset == p3, 3,
                  "not an integer in proper range");
  op = l_fseek(f, offset, mode[op]);
  if (op)
    return luaL_fileresult(L, 0, NULL);  /* error */
  else {
    lua_pushnumber(L, (lua_Number)l_ftell(f));
    return 1;
  }
}